

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::emitTriangleMesh(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  element_type *peVar2;
  vec3f *pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *v_1;
  vec3f *n;
  vec3f *v;
  element_type *b;
  SP SVar5;
  vec3f vVar6;
  SP ours;
  affine3f xfm;
  shared_ptr<pbrt::syntactic::ParamArray<float>_> alphaParam;
  allocator<char> local_119;
  __shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 local_108 [56];
  _Base_ptr local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  _Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> local_c0;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(in_RDX->_M_ptr->material).
              super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>);
  findOrCreateMaterial((SemanticParser *)local_108,(SP *)shape);
  std::make_shared<pbrt::TriangleMesh,std::shared_ptr<pbrt::Material>>
            ((shared_ptr<pbrt::Material> *)&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,in_RDX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"P",(allocator<char> *)&local_d0);
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&local_c0,
             (SemanticParser *)shape,(SP *)&local_70,(string *)local_108);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::_M_move_assign
            (&(local_118._M_ptr)->vertex,&local_c0);
  std::_Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::~_Vector_base(&local_c0)
  ;
  std::__cxx11::string::~string((string *)local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,in_RDX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"N",(allocator<char> *)&local_d0);
  extractVector<pbrt::math::vec3f>
            ((vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)&local_c0,
             (SemanticParser *)shape,(SP *)&local_80,(string *)local_108);
  std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::_M_move_assign
            (&(local_118._M_ptr)->normal,&local_c0);
  std::_Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::~_Vector_base(&local_c0)
  ;
  std::__cxx11::string::~string((string *)local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_90,in_RDX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"uv",(allocator<char> *)&local_d0);
  extractVector<pbrt::math::vec2f>
            ((vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)&local_c0,
             (SemanticParser *)shape,(SP *)&local_90,(string *)local_108);
  std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::_M_move_assign
            (&(local_118._M_ptr)->texcoord,&local_c0);
  std::_Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::~_Vector_base
            ((_Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)&local_c0);
  std::__cxx11::string::~string((string *)local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,in_RDX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"indices",(allocator<char> *)&local_d0);
  extractVector<pbrt::math::vec3i>
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)&local_c0,
             (SemanticParser *)shape,(SP *)&local_a0,(string *)local_108);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::_M_move_assign
            (&(local_118._M_ptr)->index,&local_c0);
  std::_Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::~_Vector_base
            ((_Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)&local_c0);
  std::__cxx11::string::~string((string *)local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  peVar1 = in_RDX->_M_ptr;
  local_108._0_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vx;
  local_108._8_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vx.z;
  local_108._16_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vy.y;
  local_108._24_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vz;
  local_108._32_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vz.z;
  local_108._40_4_ = (_Rb_tree_color)(peVar1->transform).atStart.p.y;
  local_108._44_4_ = (peVar1->transform).atStart.p.z;
  peVar2 = (element_type *)
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           &((local_118._M_ptr)->vertex).
            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
            super__Vector_impl_data._M_finish)->_M_pi;
  for (b = (element_type *)
           ((local_118._M_ptr)->vertex).
           super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
           super__Vector_impl_data._M_start; b != peVar2;
      b = (element_type *)
          ((long)&(b->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
                  super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> + 4)) {
    vVar6 = math::operator*((affine3f *)local_108,(vec3f *)b);
    (b->super_Entity)._vptr_Entity = vVar6._0_8_;
    *(float *)&(b->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
               super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = vVar6.z;
  }
  pvVar3 = ((local_118._M_ptr)->normal).
           super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (n = ((local_118._M_ptr)->normal).
           super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
           super__Vector_impl_data._M_start; n != pvVar3; n = n + 1) {
    vVar6 = math::xfmNormal((affine3f *)local_108,n);
    n->x = (float)(int)vVar6._0_8_;
    n->y = (float)(int)((ulong)vVar6._0_8_ >> 0x20);
    n->z = vVar6.z;
  }
  std::__shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::TriangleMesh,void>
            (local_50,&local_118);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,in_RDX);
  extractTextures((SemanticParser *)shape,(SP *)local_50,(SP *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"alpha",&local_119);
  syntactic::ParamSet::findParam<float>
            ((ParamSet *)&local_d0,(string *)&(peVar1->super_Node).super_ParamSet);
  std::__cxx11::string::~string((string *)&local_c0);
  _Var4._M_pi = local_118._M_refcount._M_pi;
  if (local_d0 != (_Base_ptr)0x0) {
    ((local_118._M_ptr)->super_Shape).alpha = (float)local_d0->_M_right->_M_color;
  }
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_118._M_ptr;
  local_118._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  local_118._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  SVar5.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar5.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitTriangleMesh(pbrt::syntactic::Shape::SP shape)
  {
    TriangleMesh::SP ours = std::make_shared<TriangleMesh>(findOrCreateMaterial(shape->material));

    // vertices - param "P", 3x float each
    ours->vertex = extractVector<vec3f>(shape,"P");
    // vertex normals - param "N", 3x float each
    ours->normal = extractVector<vec3f>(shape,"N");
    // per-vertex texture coordinates - param "uv", 2x float each
    ours->texcoord = extractVector<vec2f>(shape,"uv");
    // triangle vertex indices - param "indices", 3x int each
    ours->index = extractVector<vec3i>(shape,"indices");

    affine3f xfm = shape->transform.atStart;
    for (vec3f &v : ours->vertex)
      v = xfmPoint(xfm,v);
    for (vec3f &v : ours->normal)
      v = xfmNormal(xfm,v);
    extractTextures(ours,shape);
    
    auto alphaParam = shape->findParam<float>("alpha");
    if (alphaParam) 
      ours->alpha = alphaParam->get(0);
    
    return ours;
  }